

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_future_result(green_future_t future,void **p,int *i)

{
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (future->refs < 1) {
    green_future_result_cold_1();
    if (future == (green_future_t)0x0) {
      return 1;
    }
    if (0 < future->refs) {
      if (future->state != green_future_pending) {
        return 8;
      }
      future->state = green_future_aborted;
      return 0;
    }
    green_future_cancel_cold_1();
    halt_baddata();
  }
  if (future->state == green_future_pending) {
    return 3;
  }
  if (future->state == green_future_aborted) {
    return 8;
  }
  if (p != (void **)0x0) {
    *p = (future->result).p;
  }
  if (i != (int *)0x0) {
    *i = (future->result).i;
  }
  return 0;
}

Assistant:

int green_future_result(green_future_t future, void ** p, int * i)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);

    if (future->state == green_future_pending) {
        return GREEN_EBUSY;
    }
    if (future->state == green_future_aborted) {
        return GREEN_EBADFD;
    }
    if (p) {
        *p = future->result.p;
    }
    if (i) {
        *i = future->result.i;
    }
    return GREEN_SUCCESS;
}